

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

optional<long> __thiscall context::find_label(context *this,string_view label)

{
  const_iterator cVar1;
  _Storage<long,_true> extraout_RAX;
  _Storage<long,_true> _Var2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  optional<long> oVar4;
  allocator<char> local_41;
  key_type local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = label._M_str;
  local_20._M_len = label._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->labels)._M_h,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar3 = 0;
    _Var2 = extraout_RAX;
  }
  else {
    _Var2 = (_Storage<long,_true>)
            ((_Storage<long,_true> *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                   ._M_cur + 0x28))->_M_value;
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar3;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = _Var2._M_value;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> context::find_label(std::string_view label) const
{
    const auto it = labels.find(std::string{label});
    if (it == std::end(labels)) {
        return {};
    }
    return it->second;
}